

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O1

int Abc_NodeCollapsePermMap(Abc_Obj_t *pNode,Abc_Obj_t *pSkip,Vec_Ptr_t *vFanins,int *pPerm)

{
  int *piVar1;
  void **ppvVar2;
  Abc_Obj_t *pAVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  if (0 < vFanins->nSize) {
    lVar4 = 0;
    do {
      pPerm[lVar4] = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vFanins->nSize);
  }
  if (0 < (pNode->vFanins).nSize) {
    piVar1 = (pNode->vFanins).pArray;
    ppvVar2 = pNode->pNtk->vObjs->pArray;
    lVar4 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)ppvVar2[piVar1[lVar4]];
      if (pAVar3 != pSkip) {
        iVar5 = -1;
        if (0 < (long)vFanins->nSize) {
          lVar6 = 0;
          do {
            if ((Abc_Obj_t *)vFanins->pArray[lVar6] == pAVar3) {
              iVar5 = (int)lVar6;
              break;
            }
            lVar6 = lVar6 + 1;
          } while (vFanins->nSize != lVar6);
        }
        pPerm[lVar4] = iVar5;
        if (iVar5 == -1) {
          return 0;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pNode->vFanins).nSize);
  }
  return 1;
}

Assistant:

int Abc_NodeCollapsePermMap( Abc_Obj_t * pNode, Abc_Obj_t * pSkip, Vec_Ptr_t * vFanins, int * pPerm )
{
    Abc_Obj_t * pFanin;
    int i;
    for ( i = 0; i < Vec_PtrSize(vFanins); i++ )
        pPerm[i] = i;
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( pFanin == pSkip )
            continue;
        pPerm[i] = Abc_ObjFaninNumberNew( vFanins, pFanin );
        if ( pPerm[i] == -1 )
            return 0;
    }
    return 1;
}